

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_clone(archive_entry *entry)

{
  void *p_00;
  void *p;
  size_t s;
  ae_sparse *sp;
  ae_xattr *xp;
  archive_entry *entry2;
  archive_entry *entry_local;
  
  entry2 = entry;
  xp = (ae_xattr *)archive_entry_new2(entry->archive);
  if ((archive_entry *)xp == (archive_entry *)0x0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    memcpy(&((archive_entry *)xp)->ae_stat,&entry2->ae_stat,0xa8);
    xp[9].value = (void *)entry2->ae_fflags_set;
    xp[9].size = entry2->ae_fflags_clear;
    archive_mstring_copy((archive_mstring *)&xp[6].name,&entry2->ae_fflags_text);
    archive_mstring_copy((archive_mstring *)(xp + 10),&entry2->ae_gname);
    archive_mstring_copy((archive_mstring *)&xp[0xd].name,&entry2->ae_hardlink);
    archive_mstring_copy((archive_mstring *)&xp[0x10].value,&entry2->ae_pathname);
    archive_mstring_copy((archive_mstring *)&xp[0x1a].name,&entry2->ae_sourcepath);
    archive_mstring_copy((archive_mstring *)&xp[0x13].size,&entry2->ae_symlink);
    *(wchar_t *)&xp[6].next = entry2->ae_set;
    archive_mstring_copy((archive_mstring *)(xp + 0x17),&entry2->ae_uname);
    *(char *)&xp[0x1d].value = entry2->encryption;
    archive_acl_copy((archive_acl *)&xp[0x1e].name,&entry2->acl);
    p_00 = archive_entry_mac_metadata(entry2,(size_t *)&p);
    archive_entry_copy_mac_metadata((archive_entry *)xp,p_00,(size_t)p);
    for (sp = (ae_sparse *)entry2->xattr_head; sp != (ae_sparse *)0x0; sp = sp->next) {
      archive_entry_xattr_add_entry
                ((archive_entry *)xp,(char *)sp->offset,(void *)sp->length,(size_t)sp[1].next);
    }
    for (s = (size_t)entry2->sparse_head; s != 0; s = *(size_t *)s) {
      archive_entry_sparse_add_entry((archive_entry *)xp,*(int64_t *)(s + 8),*(int64_t *)(s + 0x10))
      ;
    }
    entry_local = (archive_entry *)xp;
  }
  return entry_local;
}

Assistant:

struct archive_entry *
archive_entry_clone(struct archive_entry *entry)
{
	struct archive_entry *entry2;
	struct ae_xattr *xp;
	struct ae_sparse *sp;
	size_t s;
	const void *p;

	/* Allocate new structure and copy over all of the fields. */
	/* TODO: Should we copy the archive over?  Or require a new archive
	 * as an argument? */
	entry2 = archive_entry_new2(entry->archive);
	if (entry2 == NULL)
		return (NULL);
	entry2->ae_stat = entry->ae_stat;
	entry2->ae_fflags_set = entry->ae_fflags_set;
	entry2->ae_fflags_clear = entry->ae_fflags_clear;

	/* TODO: XXX If clone can have a different archive, what do we do here if
	 * character sets are different? XXX */
	archive_mstring_copy(&entry2->ae_fflags_text, &entry->ae_fflags_text);
	archive_mstring_copy(&entry2->ae_gname, &entry->ae_gname);
	archive_mstring_copy(&entry2->ae_hardlink, &entry->ae_hardlink);
	archive_mstring_copy(&entry2->ae_pathname, &entry->ae_pathname);
	archive_mstring_copy(&entry2->ae_sourcepath, &entry->ae_sourcepath);
	archive_mstring_copy(&entry2->ae_symlink, &entry->ae_symlink);
	entry2->ae_set = entry->ae_set;
	archive_mstring_copy(&entry2->ae_uname, &entry->ae_uname);

	/* Copy encryption status */
	entry2->encryption = entry->encryption;
	
	/* Copy ACL data over. */
	archive_acl_copy(&entry2->acl, &entry->acl);

	/* Copy Mac OS metadata. */
	p = archive_entry_mac_metadata(entry, &s);
	archive_entry_copy_mac_metadata(entry2, p, s);

	/* Copy xattr data over. */
	xp = entry->xattr_head;
	while (xp != NULL) {
		archive_entry_xattr_add_entry(entry2,
		    xp->name, xp->value, xp->size);
		xp = xp->next;
	}

	/* Copy sparse data over. */
	sp = entry->sparse_head;
	while (sp != NULL) {
		archive_entry_sparse_add_entry(entry2,
		    sp->offset, sp->length);
		sp = sp->next;
	}

	return (entry2);
}